

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# olc_act.c
# Opt level: O0

bool redit_trap(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  CHAR_DATA *ch_00;
  char *pcVar3;
  TRAP_DATA *pTVar4;
  long in_RDI;
  int num;
  char arg1 [4608];
  TRAP_DATA *trap;
  ROOM_INDEX_DATA *pRoom;
  char *in_stack_ffffffffffffedc8;
  undefined4 in_stack_ffffffffffffedd0;
  undefined4 in_stack_ffffffffffffedd4;
  char in_stack_ffffffffffffedd8;
  undefined7 in_stack_ffffffffffffedd9;
  char *in_stack_ffffffffffffede0;
  char *in_stack_ffffffffffffedf8;
  ROOM_INDEX_DATA *argument_00;
  bool local_1;
  
  argument_00 = *(ROOM_INDEX_DATA **)(in_RDI + 0xa8);
  ch_00 = (CHAR_DATA *)
          one_argument((char *)CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0),
                       in_stack_ffffffffffffedc8);
  if ((argument_00->trap == (TRAP_DATA *)0x0) || (in_stack_ffffffffffffedd8 == '\0')) {
    if ((argument_00->trap == (TRAP_DATA *)0x0) &&
       (bVar1 = str_cmp(&stack0xffffffffffffedd8,"new"), !bVar1)) {
      pTVar4 = new_trap();
      pTVar4->room = argument_00;
      pTVar4->type = 0;
      pTVar4->quality = 0;
      pTVar4->complexity = 0;
      pTVar4->timer = 0;
      pTVar4->trig_echo = (char *)0x0;
      pTVar4->exec_echo = (char *)0x0;
      pTVar4->armed = false;
      argument_00->trap = pTVar4;
      send_to_char(in_stack_ffffffffffffede0,
                   (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffedd9,in_stack_ffffffffffffedd8));
      return true;
    }
    if (argument_00->trap == (TRAP_DATA *)0x0) {
      send_to_char(in_stack_ffffffffffffede0,
                   (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffedd9,in_stack_ffffffffffffedd8));
    }
    else {
      send_to_char(in_stack_ffffffffffffede0,
                   (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffedd9,in_stack_ffffffffffffedd8));
    }
    local_1 = false;
  }
  else {
    bVar1 = str_cmp(&stack0xffffffffffffedd8,"type");
    if (bVar1) {
      bVar1 = str_cmp(&stack0xffffffffffffedd8,"quality");
      if (bVar1) {
        bVar1 = str_cmp(&stack0xffffffffffffedd8,"complexity");
        if (bVar1) {
          bVar1 = str_cmp(&stack0xffffffffffffedd8,"timer");
          if (bVar1) {
            bVar1 = str_cmp(&stack0xffffffffffffedd8,"trigger");
            if (bVar1) {
              bVar1 = str_cmp(&stack0xffffffffffffedd8,"execute");
              if (bVar1) {
                bVar1 = str_cmp(&stack0xffffffffffffedd8,"delete");
                if (bVar1) {
                  redit_trap(ch_00,(char *)argument_00);
                  local_1 = false;
                }
                else {
                  free_trap((TRAP_DATA *)
                            CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0));
                  argument_00->trap = (TRAP_DATA *)0x0;
                  send_to_char(in_stack_ffffffffffffede0,
                               (CHAR_DATA *)
                               CONCAT71(in_stack_ffffffffffffedd9,in_stack_ffffffffffffedd8));
                  local_1 = true;
                }
              }
              else {
                pcVar3 = palloc_string(in_stack_ffffffffffffedf8);
                argument_00->trap->exec_echo = pcVar3;
                send_to_char(in_stack_ffffffffffffede0,
                             (CHAR_DATA *)
                             CONCAT71(in_stack_ffffffffffffedd9,in_stack_ffffffffffffedd8));
                local_1 = true;
              }
            }
            else {
              pcVar3 = palloc_string(in_stack_ffffffffffffedf8);
              argument_00->trap->trig_echo = pcVar3;
              send_to_char(in_stack_ffffffffffffede0,
                           (CHAR_DATA *)
                           CONCAT71(in_stack_ffffffffffffedd9,in_stack_ffffffffffffedd8));
              local_1 = true;
            }
          }
          else {
            iVar2 = atoi((char *)ch_00);
            if ((iVar2 < 0) || (0xf < iVar2)) {
              send_to_char(in_stack_ffffffffffffede0,
                           (CHAR_DATA *)
                           CONCAT71(in_stack_ffffffffffffedd9,in_stack_ffffffffffffedd8));
              local_1 = false;
            }
            else {
              argument_00->trap->timer = iVar2;
              send_to_char(in_stack_ffffffffffffede0,
                           (CHAR_DATA *)
                           CONCAT71(in_stack_ffffffffffffedd9,in_stack_ffffffffffffedd8));
              local_1 = true;
            }
          }
        }
        else {
          iVar2 = atoi((char *)ch_00);
          if ((iVar2 < 1) && (100 < iVar2)) {
            send_to_char(in_stack_ffffffffffffede0,
                         (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffedd9,in_stack_ffffffffffffedd8))
            ;
            local_1 = false;
          }
          else {
            argument_00->trap->complexity = iVar2;
            send_to_char(in_stack_ffffffffffffede0,
                         (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffedd9,in_stack_ffffffffffffedd8))
            ;
            local_1 = true;
          }
        }
      }
      else {
        iVar2 = atoi((char *)ch_00);
        if ((iVar2 < 1) || (10 < iVar2)) {
          send_to_char(in_stack_ffffffffffffede0,
                       (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffedd9,in_stack_ffffffffffffedd8));
          local_1 = false;
        }
        else {
          argument_00->trap->quality = iVar2;
          send_to_char(in_stack_ffffffffffffede0,
                       (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffedd9,in_stack_ffffffffffffedd8));
          local_1 = true;
        }
      }
    }
    else {
      iVar2 = flag_lookup((char *)CONCAT71(in_stack_ffffffffffffedd9,in_stack_ffffffffffffedd8),
                          (flag_type *)CONCAT44(in_stack_ffffffffffffedd4,in_stack_ffffffffffffedd0)
                         );
      if (iVar2 == -99) {
        send_to_char(in_stack_ffffffffffffede0,
                     (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffedd9,in_stack_ffffffffffffedd8));
        local_1 = false;
      }
      else {
        argument_00->trap->type = iVar2;
        send_to_char(in_stack_ffffffffffffede0,
                     (CHAR_DATA *)CONCAT71(in_stack_ffffffffffffedd9,in_stack_ffffffffffffedd8));
        local_1 = false;
      }
    }
  }
  return local_1;
}

Assistant:

bool redit_trap(CHAR_DATA *ch, char *argument)
{
	ROOM_INDEX_DATA *pRoom;
	TRAP_DATA *trap;
	char arg1[MSL];
	int num;

	EDIT_ROOM(ch, pRoom);

	argument = one_argument(argument, arg1);

	if (pRoom->trap && arg1[0] != '\0')
	{
		if (!str_cmp(arg1, "type"))
		{
			num = flag_lookup(argument, trap_table);

			if (num == NO_FLAG)
			{
				send_to_char("That is not a valid trap.\n\r", ch);
				return false;
			}

			pRoom->trap->type = num;
			send_to_char("Trap type updated.\n\r", ch);
		}
		else if (!str_cmp(arg1, "quality"))
		{
			num = atoi(argument);

			if (num > 0 && num < 11)
			{
				pRoom->trap->quality = num;
				send_to_char("Trap quality updated.\n\r", ch);
				return true;
			}
			else
			{
				send_to_char("Quality must be a number between 1 and 10.\n\r", ch);
				return false;
			}
		}
		else if (!str_cmp(arg1, "complexity"))
		{
			num = atoi(argument);

			if (num > 0 || num < 101)
			{
				pRoom->trap->complexity = num;
				send_to_char("Trap complexity updated.\n\r", ch);
				return true;
			}
			else
			{
				send_to_char("Complexity must be a number between 1 and 100.\n\r", ch);
				return false;
			}
		}
		else if (!str_cmp(arg1, "timer"))
		{
			num = atoi(argument);

			if (num >= 0 && num < 16)
			{
				pRoom->trap->timer = num;
				send_to_char("Trap timer updated.\n\r", ch);
				return true;
			}
			else
			{
				send_to_char("Timer must be a number between 0 (immediate) and 15 seconds.\n\r", ch);
				return false;
			}
		}
		else if (!str_cmp(arg1, "trigger"))
		{
			pRoom->trap->trig_echo = palloc_string(argument);
			send_to_char("Trigger echo updated.\n\r", ch);
			return true;
		}
		else if (!str_cmp(arg1, "execute"))
		{
			pRoom->trap->exec_echo = palloc_string(argument);
			send_to_char("Execute echo updated.\n\r", ch);
			return true;
		}
		else if (!str_cmp(arg1, "delete"))
		{
			free_trap(pRoom->trap);
			pRoom->trap = nullptr;
			send_to_char("Trap deleted.\n\r", ch);
			return true;
		}
		else
		{
			redit_trap(ch, "");
			return false;
		}
	}
	else if (!pRoom->trap && !str_cmp(arg1, "new"))
	{
		trap = new_trap();
		trap->room = pRoom;
		trap->type = TRAP_NONE;
		trap->quality = 0;
		trap->complexity = 0;
		trap->timer = 0;
		trap->trig_echo = nullptr;
		trap->exec_echo = nullptr;
		trap->armed = false;
		pRoom->trap = trap;
		send_to_char("Trap created.\n\r", ch);
		return true;
	}
	else
	{
		if (pRoom->trap)
		{
			send_to_char("Syntax:  trap type <type>\n\r"\
						 "              quality <#1-10>\n\r"\
						 "              complexity <#1-10>\n\r"\
						 "              timer <#1-10>\n\r"\
						 "              trigger <mesg>\n\r"\
						 "              execute <mesg>\n\r"\
						 "              delete\n\r", ch);
		}
		else
			send_to_char("Syntax:  trap new\n\r", ch);

		return false;
	}

	return false;
}